

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

bool __thiscall Secp256K1::createPublicKey(Secp256K1 *this,bool compressed)

{
  secp256k1_context *psVar1;
  uchar *puVar2;
  uint flags;
  size_t local_68;
  size_t outSize;
  int ret;
  secp256k1_pubkey pubkey;
  bool compressed_local;
  Secp256K1 *this_local;
  
  psVar1 = this->ctx;
  pubkey.data[0x38] = compressed;
  unique0x100000e6 = this;
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->privKey);
  outSize._0_4_ = secp256k1_ec_pubkey_create(psVar1,(secp256k1_pubkey *)((long)&outSize + 7),puVar2)
  ;
  if ((int)outSize == 1) {
    local_68 = 0x41;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->pubKey,0x41);
    psVar1 = this->ctx;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->pubKey);
    flags = 2;
    if ((pubkey.data[0x38] & 1) != 0) {
      flags = 0x102;
    }
    secp256k1_ec_pubkey_serialize
              (psVar1,puVar2,&local_68,(secp256k1_pubkey *)((long)&outSize + 7),flags);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->pubKey,local_68);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Secp256K1::createPublicKey(bool compressed)
{
    // Calculate public key.
    secp256k1_pubkey pubkey;
    int ret = secp256k1_ec_pubkey_create(ctx, &pubkey, privKey.data());
    if (ret != 1) {
        return false;
    }

    // Serialize public key.
    size_t outSize = PUBLIC_KEY_SIZE;
    pubKey.resize(outSize);
    secp256k1_ec_pubkey_serialize(
        ctx, pubKey.data(), &outSize, &pubkey,
        compressed ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    pubKey.resize(outSize);

    // Succeed.
    return true;
}